

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_value *pValue;
  int iVar1;
  unqlite_col *pCol;
  int iFlag;
  char *pcVar2;
  ulong uVar3;
  int nByte;
  SyString sName;
  
  if (argc < 2) {
    pcVar2 = "Missing collection name and/or records";
LAB_00116a2b:
    jx9_context_throw_error(pCtx,1,pcVar2);
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar2 = "Invalid collection name";
      goto LAB_00116a2b;
    }
    sName.nByte = nByte;
    sName.zString = pcVar2;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      for (uVar3 = 1; (uint)argc != uVar3; uVar3 = uVar3 + 1) {
        pValue = argv[uVar3];
        if (((pValue->iFlags & 0x40) == 0) || ((*(byte *)((pValue->x).iVal + 0x40) & 1) != 0)) {
          iVar1 = CollectionStore(pCol,pValue);
        }
        else {
          iVar1 = jx9_array_walk(pValue,CollectionRecordArrayWalker,pCol);
        }
        if (iVar1 != 0) {
          jx9_context_throw_error_format
                    (pCtx,1,"Error while storing record %d in collection \'%z\'",uVar3 & 0xffffffff,
                     &sName);
          goto LAB_00116a36;
        }
      }
      iVar1 = 1;
      goto LAB_00116a3b;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&sName);
  }
LAB_00116a36:
  iVar1 = 0;
LAB_00116a3b:
  jx9_result_bool(pCtx,iVar1);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	int i;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Store the given values */
	for( i = 1 ; i < argc ; ++i ){
		rc = unqliteCollectionPut(pCol,argv[i],0);
		if( rc != UNQLITE_OK){
			jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,
				"Error while storing record %d in collection '%z'",i,&sName
				);
			/* Return false */
			jx9_result_bool(pCtx,0);
			return JX9_OK;
		}
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx,1);
	return JX9_OK;
}